

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3WriteSegment(Fts3Table *p,sqlite3_int64 iBlock,char *z,int n)

{
  int local_34;
  sqlite3_stmt *psStack_30;
  int rc;
  sqlite3_stmt *pStmt;
  char *pcStack_20;
  int n_local;
  char *z_local;
  sqlite3_int64 iBlock_local;
  Fts3Table *p_local;
  
  pStmt._4_4_ = n;
  pcStack_20 = z;
  z_local = (char *)iBlock;
  iBlock_local = (sqlite3_int64)p;
  local_34 = fts3SqlStmt(p,9,&stack0xffffffffffffffd0,(sqlite3_value **)0x0);
  if (local_34 == 0) {
    sqlite3_bind_int64(psStack_30,1,(sqlite_int64)z_local);
    sqlite3_bind_blob(psStack_30,2,pcStack_20,pStmt._4_4_,(_func_void_void_ptr *)0x0);
    sqlite3_step(psStack_30);
    local_34 = sqlite3_reset(psStack_30);
    sqlite3_bind_null(psStack_30,2);
  }
  return local_34;
}

Assistant:

static int fts3WriteSegment(
  Fts3Table *p,                   /* Virtual table handle */
  sqlite3_int64 iBlock,           /* Block id for new block */
  char *z,                        /* Pointer to buffer containing block data */
  int n                           /* Size of buffer z in bytes */
){
  sqlite3_stmt *pStmt;
  int rc = fts3SqlStmt(p, SQL_INSERT_SEGMENTS, &pStmt, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_int64(pStmt, 1, iBlock);
    sqlite3_bind_blob(pStmt, 2, z, n, SQLITE_STATIC);
    sqlite3_step(pStmt);
    rc = sqlite3_reset(pStmt);
    sqlite3_bind_null(pStmt, 2);
  }
  return rc;
}